

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

void __thiscall
linq::IEnumerableCore<linq::IEnumerable<int_&>_>::iterator::iterator
          (iterator *this,IEnumerable<int_&> *src,bool v)

{
  int iVar1;
  undefined3 in_register_00000011;
  
  IEnumerable<int_&>::IEnumerable(&this->source,src);
  this->valid = v;
  if (CONCAT31(in_register_00000011,v) != 0) {
    (**((this->source).state.super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->_vptr_IState)();
    iVar1 = (*((this->source).state.
               super___shared_ptr<linq::IState<int_&>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    this->valid = SUB41(iVar1,0);
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}